

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

bool __thiscall sglr::rc::TextureCube::isComplete(TextureCube *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  
  uVar1 = (this->super_Texture).m_baseLevel;
  uVar8 = (ulong)uVar1;
  if ((0xd < uVar8) || (this->m_levels[0].m_data[uVar8].m_cap == 0)) {
    return false;
  }
  uVar2 = this->m_levels[0].m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[0];
  uVar3 = this->m_levels[0].m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[1];
  if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
    uVar11 = 1;
  }
  else {
    uVar6 = ((this->super_Texture).m_maxLevel - uVar1) + 1;
    uVar11 = uVar3;
    if ((int)uVar3 < (int)uVar2) {
      uVar11 = uVar2;
    }
    uVar13 = 0x20;
    if (uVar11 != 0) {
      uVar13 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = uVar13 ^ 0x1f;
    }
    uVar11 = 0x20 - uVar13;
    if ((int)uVar6 < (int)(0x20 - uVar13)) {
      uVar11 = uVar6;
    }
  }
  bVar5 = false;
  if (uVar2 == uVar3) {
    uVar12 = 0;
    if (0 < (int)uVar11) {
      uVar12 = (ulong)uVar11;
    }
    uVar10 = uVar8;
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      iVar14 = (int)uVar2 >> ((byte)uVar7 & 0x1f);
      if (iVar14 < 2) {
        iVar14 = 1;
      }
      lVar9 = 0;
      while (lVar9 + 0x540 != 0x24c0) {
        if ((((0xd < uVar1 + (int)uVar7) ||
             (*(long *)((long)&this->m_levels[0].m_data[uVar10].m_cap + lVar9) == 0)) ||
            (*(int *)((long)this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.
                            m_data + lVar9) != iVar14)) ||
           (*(int *)((long)this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.
                           m_data + lVar9 + 4) != iVar14)) {
          return false;
        }
        if (*(ChannelOrder *)
             ((long)this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.m_data +
             lVar9 + -8) !=
            this->m_levels[0].m_access[uVar8].super_ConstPixelBufferAccess.m_format.order) {
          return false;
        }
        lVar4 = lVar9 + -4;
        lVar9 = lVar9 + 0x540;
        if (*(ChannelType *)
             ((long)this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.m_data +
             lVar4) != this->m_levels[0].m_access[uVar8].super_ConstPixelBufferAccess.m_format.type)
        {
          return false;
        }
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    bVar5 = (long)(int)uVar11 <= (long)uVar7;
  }
  return bVar5;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}